

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  UpVal **ppUVar1;
  UpVal **ppUVar2;
  UpVal *pUVar3;
  TValue *pTVar4;
  ravi_type_map t2;
  ravi_type_map t1;
  LClosure *f1;
  ravi_type_map local_40;
  ravi_type_map local_3c;
  LClosure *local_38;
  
  ppUVar1 = getupvalref(L,fidx1,n1,&local_38,&local_3c);
  ppUVar2 = getupvalref(L,fidx2,n2,(LClosure **)0x0,&local_40);
  if ((local_3c == local_40) && (*ppUVar1 != *ppUVar2)) {
    luaC_upvdeccount(L,*ppUVar1);
    pUVar3 = *ppUVar2;
    *ppUVar1 = pUVar3;
    pUVar3->refcount = pUVar3->refcount + 1;
    pTVar4 = pUVar3->v;
    if (pTVar4 != (TValue *)&pUVar3->u) {
      (pUVar3->u).open.touched = 1;
      pUVar3 = *ppUVar1;
      pTVar4 = pUVar3->v;
    }
    if (((short)pTVar4->tt_ < 0) && (pTVar4 == (TValue *)&pUVar3->u)) {
      luaC_upvalbarrier_(L,(pTVar4->value_).gc);
    }
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin (lua_State *L, int fidx1, int n1,
                                            int fidx2, int n2) {
  LClosure *f1;
  ravi_type_map t1, t2;
  UpVal **up1 = getupvalref(L, fidx1, n1, &f1, &t1);
  UpVal **up2 = getupvalref(L, fidx2, n2, NULL, &t2);
  if (t1 == t2 && *up1 != *up2) {
    luaC_upvdeccount(L, *up1);
    *up1 = *up2;
    (*up1)->refcount++;
    if (upisopen(*up1)) (*up1)->u.open.touched = 1;
    luaC_upvalbarrier(L, *up1, (*up1)->v);
  }
}